

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::base::TypedConfigurations::setValue<unsigned_long>
          (TypedConfigurations *this,Level level,unsigned_long *value,
          unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          *confMap,bool includeGlobalLevel)

{
  mapped_type mVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  mapped_type *pmVar4;
  Level local_24;
  key_type local_20 [2];
  unsigned_long local_18;
  
  local_24 = level;
  if ((confMap->_M_h)._M_element_count == 0 && includeGlobalLevel) {
    local_18 = *value;
    local_20[0] = Global;
  }
  else {
    local_20[0] = Global;
    p_Var2 = utils::std::
             _Hashtable<el::Level,_std::pair<const_el::Level,_unsigned_long>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&confMap->_M_h,(ulong)((confMap->_M_h)._M_bucket_count != 1),local_20,1);
    if (p_Var2 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var2->_M_nxt;
    }
    if ((p_Var3 != (_Hash_node_base *)0x0) && (p_Var3[2]._M_nxt == (_Hash_node_base *)*value)) {
      return;
    }
    p_Var2 = utils::std::
             _Hashtable<el::Level,_std::pair<const_el::Level,_unsigned_long>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&confMap->_M_h,(ulong)local_24 % (confMap->_M_h)._M_bucket_count,&local_24,
                        (ulong)local_24);
    if ((p_Var2 != (__node_base_ptr)0x0) && (p_Var2->_M_nxt != (_Hash_node_base *)0x0)) {
      mVar1 = *value;
      pmVar4 = utils::std::__detail::
               _Map_base<el::Level,_std::pair<const_el::Level,_unsigned_long>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<el::Level,_std::pair<const_el::Level,_unsigned_long>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)confMap,&local_24);
      *pmVar4 = mVar1;
      return;
    }
    local_18 = *value;
    local_20[0] = local_24;
  }
  std::
  _Hashtable<el::Level,std::pair<el::Level_const,unsigned_long>,std::allocator<std::pair<el::Level_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<el::Level,unsigned_long>>
            ((_Hashtable<el::Level,std::pair<el::Level_const,unsigned_long>,std::allocator<std::pair<el::Level_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)confMap);
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::unordered_map<Level, Conf_T>* confMap,
                bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::unordered_map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }